

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pfx.c
# Opt level: O3

void add_ip4_pfx_record(pfx_table *pfxt,uint32_t asn,char *ip,uint8_t min_mask_len,
                       uint8_t max_mask_len)

{
  int iVar1;
  long in_FS_OFFSET;
  pfxv_state val_res;
  pfx_record pfx;
  pfxv_state local_44;
  pfx_record local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  create_ip4_pfx_record(&local_40,asn,ip,min_mask_len,'\x18');
  iVar1 = pfx_table_add(pfxt,&local_40);
  if (iVar1 != 0) {
    __assert_fail("pfx_table_add(pfxt, &pfx) == PFX_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x15a,
                  "void add_ip4_pfx_record(struct pfx_table *, uint32_t, const char *, uint8_t, uint8_t)"
                 );
  }
  iVar1 = pfx_table_validate(pfxt,local_40.asn,&local_40.prefix,local_40.min_len,&local_44);
  if (iVar1 != 0) {
    __assert_fail("pfx_table_validate(pfxt, pfx.asn, &pfx.prefix, pfx.min_len, &val_res) == PFX_SUCCESS"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x15c,
                  "void add_ip4_pfx_record(struct pfx_table *, uint32_t, const char *, uint8_t, uint8_t)"
                 );
  }
  if (local_44 != BGP_PFXV_STATE_VALID) {
    __assert_fail("val_res == BGP_PFXV_STATE_VALID",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x15d,
                  "void add_ip4_pfx_record(struct pfx_table *, uint32_t, const char *, uint8_t, uint8_t)"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void add_ip4_pfx_record(struct pfx_table *pfxt, uint32_t asn, const char *ip, uint8_t min_mask_len,
			       uint8_t max_mask_len)
{
	struct pfx_record pfx;
	enum pfxv_state val_res;

	create_ip4_pfx_record(&pfx, asn, ip, min_mask_len, max_mask_len);

	assert(pfx_table_add(pfxt, &pfx) == PFX_SUCCESS);

	assert(pfx_table_validate(pfxt, pfx.asn, &pfx.prefix, pfx.min_len, &val_res) == PFX_SUCCESS);
	assert(val_res == BGP_PFXV_STATE_VALID);
}